

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::Resize
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,hash_t nhsize)

{
  Node *block;
  long lVar1;
  Node *pNVar2;
  ulong uVar3;
  FUDMFKeys *this_00;
  bool bVar4;
  
  uVar3 = (ulong)this->Size;
  block = this->Nodes;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  this_00 = &(block->Pair).Value;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    lVar1._0_4_ = this_00[-1].super_TArray<FUDMFKey,_FUDMFKey>.Most;
    lVar1._4_4_ = this_00[-1].super_TArray<FUDMFKey,_FUDMFKey>.Count;
    if (lVar1 != 1) {
      pNVar2 = NewKey(this,*(int *)&this_00[-1].mSorted);
      FUDMFKeys::FUDMFKeys(&(pNVar2->Pair).Value,this_00);
      TArray<FUDMFKey,_FUDMFKey>::~TArray(&this_00->super_TArray<FUDMFKey,_FUDMFKey>);
    }
    this_00 = (FUDMFKeys *)&this_00[1].mSorted;
  }
  M_Free(block);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}